

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_raw.c
# Opt level: O0

int archive_read_format_raw_read_header(archive_read *a,archive_entry *entry)

{
  archive_entry *entry_00;
  archive_entry *in_RSI;
  long in_RDI;
  bool bVar1;
  raw_info *info;
  char *in_stack_ffffffffffffffd8;
  uint local_4;
  
  entry_00 = (archive_entry *)**(undefined8 **)(in_RDI + 0x948);
  bVar1 = entry_00->stat_valid == L'\0';
  if (bVar1) {
    *(undefined4 *)(in_RDI + 0x10) = 0x90000;
    *(char **)(in_RDI + 0x18) = "raw";
    archive_entry_set_pathname(entry_00,in_stack_ffffffffffffffd8);
    archive_entry_set_filetype(in_RSI,0x8000);
    archive_entry_set_perm(in_RSI,0x1a4);
  }
  local_4 = (uint)!bVar1;
  return local_4;
}

Assistant:

static int
archive_read_format_raw_read_header(struct archive_read *a,
    struct archive_entry *entry)
{
	struct raw_info *info;

	info = (struct raw_info *)(a->format->data);
	if (info->end_of_file)
		return (ARCHIVE_EOF);

	a->archive.archive_format = ARCHIVE_FORMAT_RAW;
	a->archive.archive_format_name = "raw";
	archive_entry_set_pathname(entry, "data");
	archive_entry_set_filetype(entry, AE_IFREG);
	archive_entry_set_perm(entry, 0644);
	/* I'm deliberately leaving most fields unset here. */
	return (ARCHIVE_OK);
}